

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void * TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::ThreadWork
                 (void *voidptr)

{
  undefined1 uVar1;
  TPZFMatrix<double> *assembleItem;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *in_RDI;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> data;
  TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *myptr;
  TPZFMatrix<double> *in_stack_00000230;
  TPZFMatrix<double> *in_stack_00000238;
  TPZDohrSubstructCondense<double> *in_stack_00000240;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *in_stack_ffffffffffffff78;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffa0;
  TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> local_28;
  TPZAutoPointer local_20 [8];
  TPZAutoPointer<TPZDohrAssembleItem<double>_> local_18;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *local_10;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDI;
  PopItem(in_stack_ffffffffffffffb8);
  while( true ) {
    uVar1 = TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::IsValid
                      ((TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *)
                       0x1f81715);
    if (!(bool)uVar1) break;
    TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(&local_28);
    assembleItem = ::TPZAutoPointer::operator_cast_to_TPZFMatrix_(local_20);
    TPZAutoPointer<TPZDohrAssembleItem<double>_>::operator->(&local_18);
    TPZDohrSubstructCondense<double>::Contribute_v2_local
              (in_stack_00000240,in_stack_00000238,in_stack_00000230);
    TPZAutoPointer<TPZDohrAssembleList<double>_>::operator->
              ((TPZAutoPointer<TPZDohrAssembleList<double>_> *)&local_10[2].fv2_local);
    TPZAutoPointer<TPZDohrAssembleItem<double>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<double>_> *)in_stack_ffffffffffffff80,
               (TPZAutoPointer<TPZDohrAssembleItem<double>_> *)in_stack_ffffffffffffff78);
    TPZDohrAssembleList<double>::AddItem
              ((TPZDohrAssembleList<double> *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),
               (TPZAutoPointer<TPZDohrAssembleItem<double>_> *)assembleItem);
    TPZAutoPointer<TPZDohrAssembleItem<double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<double>_> *)in_stack_ffffffffffffff80);
    PopItem(in_stack_ffffffffffffffb8);
    TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::~TPZDohrPrecondV2SubData
              (in_stack_ffffffffffffff80);
  }
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::~TPZDohrPrecondV2SubData
            (local_8);
  return local_8;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}